

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioVoice_SetOutputVoices(FAudioVoice *voice,FAudioVoiceSends *pSendList)

{
  FAudioVoiceSends *pFVar1;
  FAudioVoiceType FVar2;
  long lVar3;
  FAudioVoice *pFVar4;
  double dVar5;
  FAudio *pFVar6;
  FAudioSendDescriptor *pFVar7;
  float **ppfVar8;
  FAudioMixCallback *pp_Var9;
  float *pfVar10;
  code *pcVar11;
  FAudioFilterParameters *pFVar12;
  FAudioFilterState **ppafVar13;
  FAudioFilterState *pafVar14;
  FAudioResampleCallback *pp_Var15;
  undefined **ppuVar16;
  ulong uVar17;
  uint uVar18;
  FAudioSendDescriptor *pFVar19;
  FAudioSendDescriptor **ppFVar20;
  long lVar21;
  uint32_t uVar22;
  size_t sVar23;
  double dVar24;
  FAudioVoiceSends local_4c;
  FAudioSendDescriptor defaultSend;
  
  if (voice->type == FAUDIO_VOICE_MASTER) {
    return 0x88960001;
  }
  ppFVar20 = &pSendList->pSends;
  FAudio_PlatformLockMutex(voice->sendLock);
  pFVar1 = &voice->sends;
  for (uVar17 = 0; uVar17 < pFVar1->SendCount; uVar17 = uVar17 + 1) {
    (*voice->audio->pFree)(voice->sendCoefficients[uVar17]);
  }
  ppfVar8 = voice->sendCoefficients;
  if (ppfVar8 != (float **)0x0) {
    (*voice->audio->pFree)(ppfVar8);
  }
  if (voice->sendMix != (FAudioMixCallback *)0x0) {
    (*voice->audio->pFree)(voice->sendMix);
  }
  if (voice->sendFilter != (FAudioFilterParameters *)0x0) {
    (*voice->audio->pFree)(voice->sendFilter);
    voice->sendFilter = (FAudioFilterParameters *)0x0;
  }
  if (voice->sendFilterState != (FAudioFilterState **)0x0) {
    for (uVar17 = 0; uVar17 < pFVar1->SendCount; uVar17 = uVar17 + 1) {
      if (voice->sendFilterState[uVar17] != (FAudioFilterState *)0x0) {
        (*voice->audio->pFree)(voice->sendFilterState[uVar17]);
      }
    }
    (*voice->audio->pFree)(voice->sendFilterState);
    voice->sendFilterState = (FAudioFilterState **)0x0;
  }
  pFVar19 = (voice->sends).pSends;
  if (pFVar19 != (FAudioSendDescriptor *)0x0) {
    (*voice->audio->pFree)(pFVar19);
  }
  if (pSendList == (FAudioVoiceSends *)0x0) {
    defaultSend.Flags = 0;
    pFVar6 = voice->audio;
    defaultSend.pOutputVoice = pFVar6->master;
    pSendList = &local_4c;
    local_4c.SendCount = 1;
    ppFVar20 = &local_4c.pSends;
    local_4c.pSends = &defaultSend;
    uVar22 = 1;
  }
  else {
    uVar22 = pSendList->SendCount;
    if (uVar22 == 0) {
      voice->sendFilter = (FAudioFilterParameters *)0x0;
      voice->sendFilterState = (FAudioFilterState **)0x0;
      voice->sendCoefficients = (float **)0x0;
      voice->sendMix = (FAudioMixCallback *)0x0;
      SDL_memset(pFVar1,0,0xc);
      FAudio_PlatformUnlockMutex(voice->sendLock);
      return 0;
    }
    pFVar6 = voice->audio;
  }
  (voice->sends).SendCount = uVar22;
  pFVar7 = (FAudioSendDescriptor *)(*pFVar6->pMalloc)((ulong)pSendList->SendCount * 0xc);
  (voice->sends).pSends = pFVar7;
  pFVar19 = *ppFVar20;
  SDL_memcpy(pFVar7,pFVar19,(ulong)pSendList->SendCount * 0xc);
  ppfVar8 = (float **)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
  voice->sendCoefficients = ppfVar8;
  pp_Var9 = (FAudioMixCallback *)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
  voice->sendMix = pp_Var9;
  lVar21 = 0;
  uVar17 = 0;
  while( true ) {
    uVar18 = (uint)pFVar19;
    pFVar6 = voice->audio;
    if (pSendList->SendCount <= uVar17) break;
    lVar3 = *(long *)((long)&(*ppFVar20)->pOutputVoice + lVar21);
    uVar18 = *(uint *)((ulong)(*(int *)(lVar3 + 0xc) != 2) * 0x10 + 0xd0 + lVar3);
    pfVar10 = (float *)(*pFVar6->pMalloc)((ulong)voice->outputChannels * (ulong)uVar18 * 4);
    voice->sendCoefficients[uVar17] = pfVar10;
    pFVar19 = (FAudioSendDescriptor *)
              (FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1] + (uVar18 - 1));
    SDL_memcpy(voice->sendCoefficients[uVar17],pFVar19,(ulong)(voice->outputChannels * uVar18) << 2)
    ;
    if (voice->outputChannels == 2) {
      pcVar11 = FAudio_INTERNAL_Mix_Generic_Scalar;
      if (uVar18 - 1 < 8) {
        ppuVar16 = &PTR_FAudio_INTERNAL_Mix_2in_1out_Scalar_0012ab10;
        goto LAB_0011206c;
      }
    }
    else {
      pcVar11 = FAudio_INTERNAL_Mix_Generic_Scalar;
      if ((voice->outputChannels == 1) &&
         (pcVar11 = FAudio_INTERNAL_Mix_Generic_Scalar, uVar18 - 1 < 8)) {
        ppuVar16 = &PTR_FAudio_INTERNAL_Mix_1in_1out_Scalar_0012aad0;
LAB_0011206c:
        pcVar11 = (code *)ppuVar16[uVar18 - 1];
      }
    }
    voice->sendMix[uVar17] = pcVar11;
    if ((*(byte *)((long)&(*ppFVar20)->Flags + lVar21) & 0x80) != 0) {
      pFVar12 = voice->sendFilter;
      if (pFVar12 == (FAudioFilterParameters *)0x0) {
        pFVar12 = (FAudioFilterParameters *)
                  (*voice->audio->pMalloc)((ulong)pSendList->SendCount * 0xc);
        voice->sendFilter = pFVar12;
      }
      if (voice->sendFilterState == (FAudioFilterState **)0x0) {
        ppafVar13 = (FAudioFilterState **)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3)
        ;
        voice->sendFilterState = ppafVar13;
        SDL_memset(ppafVar13,0,(ulong)pSendList->SendCount << 3);
        pFVar12 = voice->sendFilter;
      }
      *(undefined4 *)((long)&pFVar12->Type + lVar21) = 0;
      *(undefined8 *)((long)&pFVar12->Frequency + lVar21) = 0x3f8000003f800000;
      sVar23 = (ulong)uVar18 << 4;
      pafVar14 = (FAudioFilterState *)(*voice->audio->pMalloc)(sVar23);
      voice->sendFilterState[uVar17] = pafVar14;
      pFVar19 = (FAudioSendDescriptor *)0x0;
      SDL_memset(voice->sendFilterState[uVar17],0,sVar23);
    }
    uVar17 = uVar17 + 1;
    lVar21 = lVar21 + 0xc;
  }
  pFVar4 = ((voice->sends).pSends)->pOutputVoice;
  dVar24 = (double)*(uint *)((long)&pFVar4->field_18 +
                            (ulong)(pFVar4->type != FAUDIO_VOICE_MASTER) * 0x10 + 0x14);
  dVar5 = (double)SDL_ceil(SUB84(((double)pFVar6->updateSize * dVar24) /
                                 (double)(pFVar6->master->field_18).master.inputSampleRate,0));
  FVar2 = voice->type;
  if (FVar2 == FAUDIO_VOICE_MASTER) {
    uVar18 = (voice->field_18).master.inputChannels;
  }
  else if (FVar2 == FAUDIO_VOICE_SUBMIX) {
    uVar18 = (voice->field_18).mix.inputChannels;
  }
  else if (FVar2 == FAUDIO_VOICE_SOURCE) {
    uVar18 = (uint)((voice->field_18).src.format)->nChannels;
  }
  uVar22 = (uint32_t)(long)dVar5;
  FAudio_INTERNAL_ResizeResampleCache(voice->audio,uVar18 * uVar22);
  if (voice->type == FAUDIO_VOICE_SOURCE) {
    (voice->field_18).src.resampleSamples = uVar22;
    goto LAB_00112281;
  }
  (voice->field_18).src.resampleSamples = uVar22;
  dVar24 = ((double)(voice->field_18).mix.inputSampleRate / dVar24) * 4294967296.0 + 0.5;
  uVar17 = (ulong)dVar24;
  uVar17 = (long)(dVar24 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17;
  (voice->field_18).src.resampleStep = uVar17;
  uVar18 = (voice->field_18).mix.inputChannels;
  if ((voice->field_18).src.decodeSamples / uVar18 <
      (uint)(((long)dVar5 & 0xffffffffU) * uVar17 >> 0x20)) {
    (voice->field_18).src.resampleSamples = uVar22 - 1;
  }
  if (uVar18 == 2) {
    pp_Var15 = &FAudio_INTERNAL_ResampleStereo;
LAB_0011226e:
    pcVar11 = *pp_Var15;
  }
  else {
    if (uVar18 == 1) {
      pp_Var15 = &FAudio_INTERNAL_ResampleMono;
      goto LAB_0011226e;
    }
    pcVar11 = FAudio_INTERNAL_ResampleGeneric;
  }
  (voice->field_18).mix.resample = pcVar11;
LAB_00112281:
  FAudio_PlatformUnlockMutex(voice->sendLock);
  return 0;
}

Assistant:

uint32_t FAudioVoice_SetOutputVoices(
	FAudioVoice *voice,
	const FAudioVoiceSends *pSendList
) {
	uint32_t i;
	uint32_t outChannels;
	uint32_t channelCount;
	uint32_t outSampleRate;
	uint32_t newResampleSamples;
	uint64_t resampleSanityCheck;
	FAudioVoiceSends defaultSends;
	FAudioSendDescriptor defaultSend;

	LOG_API_ENTER(voice->audio)

	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* FIXME: This is lazy... */
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		voice->audio->pFree(voice->sendCoefficients[i]);
	}
	if (voice->sendCoefficients != NULL)
	{
		voice->audio->pFree(voice->sendCoefficients);
	}
	if (voice->sendMix != NULL)
	{
		voice->audio->pFree(voice->sendMix);
	}
	if (voice->sendFilter != NULL)
	{
		voice->audio->pFree(voice->sendFilter);
		voice->sendFilter = NULL;
	}
	if (voice->sendFilterState != NULL)
	{
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			if (voice->sendFilterState[i] != NULL)
			{
				voice->audio->pFree(voice->sendFilterState[i]);
			}
		}
		voice->audio->pFree(voice->sendFilterState);
		voice->sendFilterState = NULL;
	}
	if (voice->sends.pSends != NULL)
	{
		voice->audio->pFree(voice->sends.pSends);
	}

	if (pSendList == NULL)
	{
		/* Default to the mastering voice as output */
		defaultSend.Flags = 0;
		defaultSend.pOutputVoice = voice->audio->master;
		defaultSends.SendCount = 1;
		defaultSends.pSends = &defaultSend;
		pSendList = &defaultSends;
	}
	else if (pSendList->SendCount == 0)
	{
		/* No sends? Nothing to do... */
		voice->sendCoefficients = NULL;
		voice->sendMix = NULL;
		voice->sendFilter = NULL;
		voice->sendFilterState = NULL;
		FAudio_zero(&voice->sends, sizeof(FAudioVoiceSends));
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)

		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Copy send list */
	voice->sends.SendCount = pSendList->SendCount;
	voice->sends.pSends = (FAudioSendDescriptor*) voice->audio->pMalloc(
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);
	FAudio_memcpy(
		voice->sends.pSends,
		pSendList->pSends,
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);

	/* Allocate/Reset default output matrix, mixer function, filters */
	voice->sendCoefficients = (float**) voice->audio->pMalloc(
		sizeof(float*) * pSendList->SendCount
	);
	voice->sendMix = (FAudioMixCallback*) voice->audio->pMalloc(
		sizeof(FAudioMixCallback) * pSendList->SendCount
	);
	for (i = 0; i < pSendList->SendCount; i += 1)
	{
		if (pSendList->pSends[i].pOutputVoice->type == FAUDIO_VOICE_MASTER)
		{
			outChannels = pSendList->pSends[i].pOutputVoice->master.inputChannels;
		}
		else
		{
			outChannels = pSendList->pSends[i].pOutputVoice->mix.inputChannels;
		}
		voice->sendCoefficients[i] = (float*) voice->audio->pMalloc(
			sizeof(float) * voice->outputChannels * outChannels
		);

		FAudio_assert(voice->outputChannels > 0 && voice->outputChannels < 9);
		FAudio_assert(outChannels > 0 && outChannels < 9);
		FAudio_memcpy(
			voice->sendCoefficients[i],
			FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1][outChannels - 1],
			voice->outputChannels * outChannels * sizeof(float)
		);

		if (voice->outputChannels == 1)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic_Scalar;
			}
		}
		else if (voice->outputChannels == 2)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic_Scalar;
			}
		}
		else
		{
			voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic_Scalar;
		}

		if (pSendList->pSends[i].Flags & FAUDIO_SEND_USEFILTER)
		{
			/* Allocate the whole send filter array if needed... */
			if (voice->sendFilter == NULL)
			{
				voice->sendFilter = (FAudioFilterParameters*) voice->audio->pMalloc(
					sizeof(FAudioFilterParameters) * pSendList->SendCount
				);
			}
			if (voice->sendFilterState == NULL)
			{
				voice->sendFilterState = (FAudioFilterState**) voice->audio->pMalloc(
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
				FAudio_zero(
					voice->sendFilterState,
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
			}

			/* ... then fill in this send's filter data */
			voice->sendFilter[i].Type = FAUDIO_DEFAULT_FILTER_TYPE;
			voice->sendFilter[i].Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			voice->sendFilter[i].OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			voice->sendFilterState[i] = (FAudioFilterState*) voice->audio->pMalloc(
				sizeof(FAudioFilterState) * outChannels
			);
			FAudio_zero(
				voice->sendFilterState[i],
				sizeof(FAudioFilterState) * outChannels
			);
		}
	}

	/* Allocate resample cache */
	outSampleRate = voice->sends.pSends[0].pOutputVoice->type == FAUDIO_VOICE_MASTER ?
		voice->sends.pSends[0].pOutputVoice->master.inputSampleRate :
		voice->sends.pSends[0].pOutputVoice->mix.inputSampleRate;
	newResampleSamples = (uint32_t) FAudio_ceil(
		voice->audio->updateSize *
		(double) outSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	);
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		channelCount = voice->src.format->nChannels;
	}
	else if (voice->type == FAUDIO_VOICE_SUBMIX)
	{
		channelCount = voice->mix.inputChannels;
	}
	else if (voice->type == FAUDIO_VOICE_MASTER)
	{
		channelCount = voice->master.inputChannels;
	}
	FAudio_INTERNAL_ResizeResampleCache(
		voice->audio,
		newResampleSamples * channelCount
	);
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		voice->src.resampleSamples = newResampleSamples;
	}
	else
	{
		voice->mix.outputSamples = newResampleSamples;

		voice->mix.resampleStep = DOUBLE_TO_FIXED((
			(double) voice->mix.inputSampleRate /
			(double) outSampleRate
		));

		/* Because we used ceil earlier, there's a chance that
		 * downsampling submixes will go past the number of samples
		 * available. Sources can do this thanks to padding, but we
		 * don't have that luxury for submixes, so unfortunately we
		 * just have to undo the ceil and turn it into a floor.
		 * -flibit
		 */
		resampleSanityCheck = (
			voice->mix.resampleStep * voice->mix.outputSamples
		) >> FIXED_PRECISION;
		if (resampleSanityCheck > (voice->mix.inputSamples / voice->mix.inputChannels))
		{
			voice->mix.outputSamples -= 1;
		}

		if (voice->mix.inputChannels == 1)
		{
			voice->mix.resample = FAudio_INTERNAL_ResampleMono;
		}
		else if (voice->mix.inputChannels == 2)
		{
			voice->mix.resample = FAudio_INTERNAL_ResampleStereo;
		}
		else
		{
			voice->mix.resample = FAudio_INTERNAL_ResampleGeneric;
		}
	}

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}